

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

predictor * __thiscall
Search::predictor::add_condition_range(predictor *this,ptag hi,ptag count,char name0)

{
  uint in_EDX;
  uint in_ESI;
  predictor *in_RDI;
  char name;
  ptag i;
  uint *in_stack_ffffffffffffffc8;
  uint local_20;
  predictor *local_8;
  
  local_8 = in_RDI;
  if (in_EDX != 0) {
    for (local_20 = 0; (local_8 = in_RDI, local_20 < in_EDX && (local_20 <= in_ESI));
        local_20 = local_20 + 1) {
      v_array<unsigned_int>::push_back((v_array<unsigned_int> *)in_RDI,in_stack_ffffffffffffffc8);
      v_array<char>::push_back((v_array<char> *)in_RDI,(char *)in_stack_ffffffffffffffc8);
    }
  }
  return local_8;
}

Assistant:

predictor& predictor::add_condition_range(ptag hi, ptag count, char name0)
{
  if (count == 0)
    return *this;
  for (ptag i = 0; i < count; i++)
  {
    if (i > hi)
      break;
    char name = name0 + i;
    condition_on_tags.push_back(hi - i);
    condition_on_names.push_back(name);
  }
  return *this;
}